

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O2

void __thiscall
t_dart_generator::print_const_value
          (t_dart_generator *this,ostream *out,string *name,t_type *type,t_const_value *value,
          bool in_static,bool defval)

{
  int *piVar1;
  long lVar2;
  string name_00;
  string name_01;
  string name_02;
  string name_03;
  string name_04;
  __type _Var3;
  char cVar4;
  int iVar5;
  t_const_value *ptVar6;
  ostream *poVar7;
  _Rb_tree_node_base *p_Var8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  t_const_value *type_00;
  pointer pptVar11;
  char *pcVar12;
  long *plVar13;
  undefined8 in_stack_fffffffffffffe58;
  t_const_value *ptVar14;
  _Rb_tree_node_base *p_Var15;
  undefined8 in_stack_fffffffffffffe70;
  t_dart_generator *this_00;
  t_dart_generator *ptVar16;
  string v2;
  string val_1;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  ptVar6 = (t_const_value *)t_type::get_true_type(type);
  t_generator::indent((t_generator *)this,out);
  if (!defval) {
    pcVar12 = "public static final ";
    if (in_static) {
      pcVar12 = "public var ";
    }
    std::operator<<(out,pcVar12 + 7);
  }
  ptVar14 = ptVar6;
  iVar5 = (*((t_doc *)&ptVar6->mapVal_)->_vptr_t_doc[5])(ptVar6);
  if ((char)iVar5 != '\0') {
    if (!defval) {
      type_name_abi_cxx11_(&v2,this,(t_type *)ptVar14);
      poVar7 = std::operator<<(out,(string *)&v2);
      std::operator<<(poVar7," ");
      std::__cxx11::string::~string((string *)&v2);
    }
    std::__cxx11::string::string(local_b0,(string *)name);
    name_00._M_string_length = (size_type)ptVar14;
    name_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe58;
    name_00.field_2._M_allocated_capacity = (size_type)value;
    name_00.field_2._8_8_ = in_stack_fffffffffffffe70;
    render_const_value(&v2,this,out,name_00,type,ptVar14);
    std::__cxx11::string::~string(local_b0);
    std::operator<<(out,(string *)name);
    poVar7 = std::operator<<(out," = ");
    poVar7 = std::operator<<(poVar7,(string *)&v2);
    poVar7 = std::operator<<(poVar7,";");
    poVar7 = std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&v2);
    return;
  }
  iVar5 = (*((t_doc *)&ptVar6->mapVal_)->_vptr_t_doc[10])(ptVar6);
  if ((char)iVar5 == '\0') {
    iVar5 = (*((t_doc *)&ptVar6->mapVal_)->_vptr_t_doc[0xb])(ptVar6);
    this_00 = this;
    if (((char)iVar5 == '\0') &&
       (iVar5 = (*((t_doc *)&ptVar6->mapVal_)->_vptr_t_doc[0xc])(ptVar6), (char)iVar5 == '\0')) {
      iVar5 = (*((t_doc *)&ptVar6->mapVal_)->_vptr_t_doc[0x10])(ptVar6);
      if ((char)iVar5 != '\0') {
        if (!defval) {
          type_name_abi_cxx11_(&v2,this,(t_type *)ptVar14);
          poVar7 = std::operator<<(out,(string *)&v2);
          std::operator<<(poVar7," ");
          std::__cxx11::string::~string((string *)&v2);
        }
        poVar7 = std::operator<<(out,(string *)name);
        std::operator<<(poVar7," =");
        std::__cxx11::string::string((string *)&local_130," ",(allocator *)&v2);
        scope_up(this,out,&local_130);
        std::__cxx11::string::~string((string *)&local_130);
        ptVar6 = *(t_const_value **)&ptVar14[1].mapVal_._M_t._M_impl.super__Rb_tree_header._M_header
        ;
        ptVar14 = (t_const_value *)
                  ptVar14[1].mapVal_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var15 = &(value->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header;
        p_Var8 = (value->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        type_00 = ptVar6;
        while (p_Var8 != p_Var15) {
          std::__cxx11::string::string(local_70,(string *)name);
          name_02._M_string_length = (size_type)ptVar14;
          name_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe58;
          name_02.field_2._M_allocated_capacity = (size_type)p_Var15;
          name_02.field_2._8_8_ = this_00;
          render_const_value(&v2,this_00,out,name_02,(t_type *)type_00,ptVar6);
          std::__cxx11::string::~string(local_70);
          std::__cxx11::string::string(local_f0,(string *)name);
          name_03._M_string_length = (size_type)ptVar14;
          name_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe58;
          name_03.field_2._M_allocated_capacity = (size_type)p_Var15;
          name_03.field_2._8_8_ = this_00;
          ptVar16 = this_00;
          render_const_value(&val_1,this_00,out,name_03,(t_type *)type_00,ptVar14);
          std::__cxx11::string::~string(local_f0);
          poVar7 = t_generator::indent((t_generator *)this_00,out);
          poVar7 = std::operator<<(poVar7,(string *)&v2);
          poVar7 = std::operator<<(poVar7,": ");
          poVar7 = std::operator<<(poVar7,(string *)&val_1);
          poVar7 = std::operator<<(poVar7,",");
          std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
          std::__cxx11::string::~string((string *)&val_1);
          std::__cxx11::string::~string((string *)&v2);
          p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
          this_00 = ptVar16;
        }
        std::operator+(&local_110,";",&::endl_abi_cxx11_);
        scope_down(this_00,out,&local_110);
        std::__cxx11::string::~string((string *)&local_110);
        goto LAB_00191d24;
      }
      iVar5 = (*((t_doc *)&ptVar6->mapVal_)->_vptr_t_doc[0xe])(ptVar6);
      if (((char)iVar5 == '\0') &&
         (cVar4 = (**(code **)(*(long *)&(ptVar14->mapVal_)._M_t._M_impl + 0x78))(), cVar4 == '\0'))
      {
        pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __cxa_allocate_exception(0x20);
        pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (**(code **)(*(long *)&(ptVar14->mapVal_)._M_t._M_impl + 0x18))();
        std::operator+(pbVar9,"compiler error: no const of type ",pbVar10);
        __cxa_throw(pbVar9,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
      }
      if (!defval) {
        type_name_abi_cxx11_(&v2,this,(t_type *)ptVar14);
        poVar7 = std::operator<<(out,(string *)&v2);
        std::operator<<(poVar7," ");
        std::__cxx11::string::~string((string *)&v2);
      }
      poVar7 = std::operator<<(out,(string *)name);
      std::operator<<(poVar7," = ");
      ptVar6 = ptVar14;
      cVar4 = (**(code **)(*(long *)&(ptVar14->mapVal_)._M_t._M_impl + 0x70))(ptVar14);
      if (cVar4 == '\0') {
        poVar7 = std::operator<<(out,"new ");
        type_name_abi_cxx11_(&v2,this,(t_type *)ptVar14);
        poVar7 = std::operator<<(poVar7,(string *)&v2);
        poVar7 = std::operator<<(poVar7,".from([");
        std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&v2);
      }
      else {
        poVar7 = std::operator<<(out,"[");
        std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
      }
      ptVar14 = *(t_const_value **)&ptVar6[1].mapVal_._M_t._M_impl.super__Rb_tree_header._M_header;
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
      ptVar16 = this_00;
      for (pptVar11 = (value->listVal_).
                      super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl.
                      super__Vector_impl_data._M_start;
          pptVar11 !=
          (value->listVal_).super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>.
          _M_impl.super__Vector_impl_data._M_finish; pptVar11 = pptVar11 + 1) {
        std::__cxx11::string::string(local_90,(string *)name);
        name_04._M_string_length = (size_type)ptVar6;
        name_04._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe58;
        name_04.field_2._M_allocated_capacity = (size_type)value;
        name_04.field_2._8_8_ = ptVar16;
        render_const_value(&v2,this_00,out,name_04,type,ptVar14);
        std::__cxx11::string::~string(local_90);
        poVar7 = t_generator::indent((t_generator *)this_00,out);
        poVar7 = std::operator<<(poVar7,(string *)&v2);
        poVar7 = std::operator<<(poVar7,",");
        std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&v2);
      }
      piVar1 = &(ptVar16->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + -1;
      cVar4 = (**(code **)(*(long *)&(ptVar6->mapVal_)._M_t._M_impl + 0x70))();
      out = t_generator::indent((t_generator *)ptVar16,out);
      if (cVar4 == '\0') {
        pcVar12 = "]);";
      }
      else {
        pcVar12 = "];";
      }
    }
    else {
      type_name_abi_cxx11_(&v2,this,(t_type *)ptVar6);
      poVar7 = std::operator<<(out,(string *)&v2);
      poVar7 = std::operator<<(poVar7," ");
      poVar7 = std::operator<<(poVar7,(string *)name);
      poVar7 = std::operator<<(poVar7," = new ");
      type_name_abi_cxx11_(&val_1,this,(t_type *)ptVar14);
      poVar7 = std::operator<<(poVar7,(string *)&val_1);
      std::operator<<(poVar7,"()");
      std::__cxx11::string::~string((string *)&val_1);
      std::__cxx11::string::~string((string *)&v2);
      piVar1 = &(this_00->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
      p_Var15 = &(value->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header;
      for (p_Var8 = (value->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          p_Var8 != p_Var15; p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
        ptVar6 = (t_const_value *)0x0;
        for (plVar13 = *(long **)&(ptVar14->identifierVal_).field_2;
            plVar13 != *(long **)((long)&(ptVar14->identifierVal_).field_2 + 8);
            plVar13 = plVar13 + 1) {
          lVar2 = *plVar13;
          std::__cxx11::string::string((string *)&v2,(string *)(*(long *)(p_Var8 + 1) + 0x48));
          _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(lVar2 + 0x68),&v2);
          std::__cxx11::string::~string((string *)&v2);
          if (_Var3) {
            ptVar6 = *(t_const_value **)(*plVar13 + 0x60);
          }
        }
        if (ptVar6 == (t_const_value *)0x0) {
          pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __cxa_allocate_exception(0x20);
          pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (**(code **)(*(long *)&(ptVar14->mapVal_)._M_t._M_impl + 0x18))();
          std::operator+(&val_1,"type error: ",pbVar10);
          std::operator+(&v2,&val_1," has no field ");
          std::__cxx11::string::string((string *)&local_d0,(string *)(*(long *)(p_Var8 + 1) + 0x48))
          ;
          std::operator+(pbVar9,&v2,&local_d0);
          __cxa_throw(pbVar9,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
        }
        std::__cxx11::string::string(local_50,(string *)name);
        name_01._M_string_length = (size_type)ptVar14;
        name_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe58;
        name_01.field_2._M_allocated_capacity = (size_type)p_Var15;
        name_01.field_2._8_8_ = this_00;
        render_const_value(&v2,this_00,out,name_01,type,ptVar6);
        std::__cxx11::string::~string(local_50);
        std::operator<<(out,(string *)&::endl_abi_cxx11_);
        poVar7 = t_generator::indent((t_generator *)this_00,out);
        poVar7 = std::operator<<(poVar7,"..");
        std::__cxx11::string::string((string *)&val_1,(string *)(*(long *)(p_Var8 + 1) + 0x48));
        poVar7 = std::operator<<(poVar7,(string *)&val_1);
        poVar7 = std::operator<<(poVar7," = ");
        std::operator<<(poVar7,(string *)&v2);
        std::__cxx11::string::~string((string *)&val_1);
        std::__cxx11::string::~string((string *)&v2);
      }
      piVar1 = &(this_00->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + -1;
      pcVar12 = ";";
    }
    out = std::operator<<(out,pcVar12);
  }
  else {
    if (!defval) {
      type_name_abi_cxx11_(&v2,this,(t_type *)ptVar14);
      poVar7 = std::operator<<(out,(string *)&v2);
      std::operator<<(poVar7," ");
      std::__cxx11::string::~string((string *)&v2);
    }
    std::operator<<(out,(string *)name);
    poVar7 = std::operator<<(out," = ");
    t_const_value::get_integer(value);
    poVar7 = std::ostream::_M_insert<long>((long)poVar7);
    poVar7 = std::operator<<(poVar7,";");
    out = std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  }
LAB_00191d24:
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_dart_generator::print_const_value(std::ostream& out,
                                        string name,
                                        t_type* type,
                                        t_const_value* value,
                                        bool in_static,
                                        bool defval) {
  type = get_true_type(type);

  indent(out);
  if (!defval) {
    out << (in_static ? "var " : "static final ");
  }
  if (type->is_base_type()) {
    if (!defval) {
      out << type_name(type) << " ";
    }
    string v2 = render_const_value(out, name, type, value);
    out << name;
    out << " = " << v2 << ";" << endl << endl;
  } else if (type->is_enum()) {
    if (!defval) {
      out << type_name(type) << " ";
    }
    out << name;
    out << " = " << value->get_integer() << ";" << endl << endl;
  } else if (type->is_struct() || type->is_xception()) {
    const vector<t_field*>& fields = ((t_struct*)type)->get_members();
    vector<t_field*>::const_iterator f_iter;
    const map<t_const_value*, t_const_value*, t_const_value::value_compare>& val = value->get_map();
    map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;
    out << type_name(type) << " " << name << " = new " << type_name(type) << "()";
    indent_up();
    for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
      t_type* field_type = nullptr;
      for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
        if ((*f_iter)->get_name() == v_iter->first->get_string()) {
          field_type = (*f_iter)->get_type();
        }
      }
      if (field_type == nullptr) {
        throw "type error: " + type->get_name() + " has no field " + v_iter->first->get_string();
      }
      string val = render_const_value(out, name, field_type, v_iter->second);
      out << endl;
      indent(out) << ".." << v_iter->first->get_string() << " = " << val;
    }
    indent_down();
    out << ";" << endl;
  } else if (type->is_map()) {
    if (!defval) {
      out << type_name(type) << " ";
    }
    out << name << " =";
    scope_up(out);

    t_type* ktype = ((t_map*)type)->get_key_type();
    t_type* vtype = ((t_map*)type)->get_val_type();
    const map<t_const_value*, t_const_value*, t_const_value::value_compare>& val = value->get_map();
    map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;

    for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
      string key = render_const_value(out, name, ktype, v_iter->first);
      string val = render_const_value(out, name, vtype, v_iter->second);
      indent(out) << key << ": " << val << "," << endl;
    }
    scope_down(out, ";" + endl);

    out << endl;
  } else if (type->is_list() || type->is_set()) {
    if (!defval) {
      out << type_name(type) << " ";
    }
    out << name << " = ";
    t_type* etype;
    if (type->is_list()) {
      out << "[" << endl;
      etype = ((t_list*)type)->get_elem_type();
    } else {
      out << "new " << type_name(type) << ".from([" << endl;
      etype = ((t_set*)type)->get_elem_type();
    }
    const vector<t_const_value*>& val = value->get_list();
    vector<t_const_value*>::const_iterator v_iter;

    indent_up();
    for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
      string val = render_const_value(out, name, etype, *v_iter);
      indent(out) << val << "," << endl;
    }
    indent_down();

    if (type->is_list()) {
      indent(out) << "];" << endl;
    } else {
      indent(out) << "]);" << endl;
    }

  } else {
    throw "compiler error: no const of type " + type->get_name();
  }
}